

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteObservations.cpp
# Opt level: O2

string * __thiscall
MADPComponentDiscreteObservations::SoftPrintObservationSets_abi_cxx11_
          (string *__return_storage_ptr__,MADPComponentDiscreteObservations *this)

{
  pointer pvVar1;
  pointer pOVar2;
  ostream *poVar3;
  E *this_00;
  uint agentI;
  ulong uVar4;
  pointer pOVar5;
  stringstream ss_1;
  ostream local_330 [376];
  stringstream ss;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  if (this->_m_initialized != false) {
    poVar3 = std::operator<<(local_1a8,"Observations:");
    std::endl<char,std::char_traits<char>>(poVar3);
    for (agentI = 0; uVar4 = (ulong)agentI,
        uVar4 < (ulong)((long)(this->_m_nrObservations).
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->_m_nrObservations).
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 3); agentI = agentI + 1) {
      poVar3 = std::operator<<(local_1a8,"agentI ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      poVar3 = std::operator<<(poVar3," - nrObservations ");
      GetNrObservations(this,agentI);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::endl<char,std::char_traits<char>>(poVar3);
      pvVar1 = (this->_m_observationVecs).
               super__Vector_base<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>,_std::allocator<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pOVar2 = *(pointer *)
                ((long)&pvVar1[uVar4].
                        super__Vector_base<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>
                        ._M_impl.super__Vector_impl_data + 8);
      for (pOVar5 = pvVar1[uVar4].
                    super__Vector_base<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>.
                    _M_impl.super__Vector_impl_data._M_start; pOVar5 != pOVar2; pOVar5 = pOVar5 + 1)
      {
        (**(code **)((long)(pOVar5->super_Observation).super_NamedDescribedEntity.
                           _vptr_NamedDescribedEntity + 0x10))((string *)&ss_1,pOVar5);
        poVar3 = std::operator<<(local_1a8,(string *)&ss_1);
        std::endl<char,std::char_traits<char>>(poVar3);
        std::__cxx11::string::~string((string *)&ss_1);
      }
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    return __return_storage_ptr__;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss_1);
  poVar3 = std::operator<<(local_330,"MADPComponentDiscreteObservations::PrintObservationSets(");
  poVar3 = std::operator<<(poVar3,") - Error: not initialized. ");
  std::endl<char,std::char_traits<char>>(poVar3);
  this_00 = (E *)__cxa_allocate_exception(0x28);
  E::E(this_00,&ss_1);
  __cxa_throw(this_00,&E::typeinfo,E::~E);
}

Assistant:

string MADPComponentDiscreteObservations::SoftPrintObservationSets() const
{    
    stringstream ss;
    if(!_m_initialized)
    {
    stringstream ss;
        ss << "MADPComponentDiscreteObservations::PrintObservationSets("<< 
        ") - Error: not initialized. "<<endl;
        throw E(ss);
    }
    ss << "Observations:"<<endl;
    for(Index agentIndex=0; agentIndex < _m_nrObservations.size(); agentIndex++)
    {
    ss << "agentI " << agentIndex << " - nrObservations " << 
        GetNrObservations(agentIndex)<<endl;
    vector<ObservationDiscrete>::const_iterator f =
        _m_observationVecs[agentIndex].begin();
    vector<ObservationDiscrete>::const_iterator l =
        _m_observationVecs[agentIndex].end();
    while(f != l)
    {
        ss << (*f).SoftPrint() << endl;
//        GetName() << " - " << (*f).GetDescription()<<endl;
        f++;
    }
    }
    return(ss.str());
}